

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall
CConnman::AddWhitelistPermissionFlags
          (CConnman *this,NetPermissionFlags *flags,CNetAddr *addr,
          vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *ranges)

{
  long lVar1;
  pointer pNVar2;
  NetPermissionFlags NVar3;
  bool bVar4;
  NetPermissionFlags NVar5;
  NetWhitelistPermissions *subnet;
  pointer pNVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = (ranges->
           super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pNVar6 = (ranges->
                super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>
                )._M_impl.super__Vector_impl_data._M_start; pNVar6 != pNVar2; pNVar6 = pNVar6 + 1) {
    bVar4 = CSubNet::Match(&pNVar6->m_subnet,addr);
    if (bVar4) {
      *flags = *flags | (pNVar6->super_NetPermissions).m_flags;
    }
  }
  if ((int)*flags < 0) {
    NVar5 = *flags & ~Implicit;
    NVar3 = NVar5 | ForceRelay;
    if (this->whitelist_forcerelay == false) {
      NVar3 = NVar5;
    }
    NVar5 = NVar3 | Relay;
    if (this->whitelist_relay == false) {
      NVar5 = NVar3;
    }
    *flags = NVar5 | 0x70;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::AddWhitelistPermissionFlags(NetPermissionFlags& flags, const CNetAddr &addr, const std::vector<NetWhitelistPermissions>& ranges) const {
    for (const auto& subnet : ranges) {
        if (subnet.m_subnet.Match(addr)) {
            NetPermissions::AddFlag(flags, subnet.m_flags);
        }
    }
    if (NetPermissions::HasFlag(flags, NetPermissionFlags::Implicit)) {
        NetPermissions::ClearFlag(flags, NetPermissionFlags::Implicit);
        if (whitelist_forcerelay) NetPermissions::AddFlag(flags, NetPermissionFlags::ForceRelay);
        if (whitelist_relay) NetPermissions::AddFlag(flags, NetPermissionFlags::Relay);
        NetPermissions::AddFlag(flags, NetPermissionFlags::Mempool);
        NetPermissions::AddFlag(flags, NetPermissionFlags::NoBan);
    }
}